

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall kj::Vector<int>::setCapacity(Vector<int> *this,size_t newSize)

{
  char (*pacVar1) [7];
  ArrayBuilder<int>_conflict newBuilder;
  ArrayBuilder<int>_conflict local_30;
  
  pacVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pacVar1 >> 2)) {
    (this->builder).pos = (RemoveConst<int> *)(*pacVar1 + newSize * 4);
  }
  local_30.ptr = (char (*) [7])_::HeapArrayDisposer::allocateUninitialized<int>(newSize);
  local_30.endPtr = (char (*) [7])(*local_30.ptr + newSize * 4);
  local_30.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_30.pos = (RemoveConst<int> *)local_30.ptr;
  ArrayBuilder<int>::addAll<kj::ArrayBuilder<int>>((ArrayBuilder<int> *)&local_30,&this->builder);
  ArrayBuilder<int>::operator=((ArrayBuilder<int> *)this,&local_30);
  ArrayBuilder<int>::dispose((ArrayBuilder<int> *)&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }